

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PSEngine.cpp
# Opt level: O1

optional<PSEngine::TurnHistory> * __thiscall
PSEngine::receive_input
          (optional<PSEngine::TurnHistory> *__return_storage_ptr__,PSEngine *this,InputType p_input)

{
  int iVar1;
  element_type *peVar2;
  int iVar3;
  long *plVar4;
  _Rb_tree_node_base *p_Var5;
  long *plVar6;
  pointer pCVar7;
  element_type *peVar8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  bool bVar9;
  undefined1 local_160 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_140;
  optional<PSEngine::TurnHistory> *local_130;
  pointer local_128;
  long *local_120;
  long local_118;
  long local_110;
  undefined4 uStack_108;
  undefined4 uStack_104;
  long *local_100;
  long local_f8;
  long local_f0 [2];
  long *local_e0 [2];
  long local_d0 [2];
  long *local_c0 [2];
  long local_b0 [2];
  long *local_a0 [2];
  long local_90 [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_PSEngine::InputType>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_PSEngine::InputType>_>,_ci_less,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_PSEngine::InputType>_>_>
  local_60;
  
  local_100 = local_f0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_100,"");
  local_160._0_4_ = Input;
  local_160._8_8_ = 0xbf800000ffffffff;
  local_160._4_4_ = p_input;
  local_160._16_8_ = &local_140;
  std::__cxx11::string::_M_construct<char*>
            ((string *)(local_160 + 0x10),local_100,local_f8 + (long)local_100);
  std::vector<PSEngine::Operation,_std::allocator<PSEngine::Operation>_>::
  emplace_back<PSEngine::Operation>(&this->m_operation_history,(Operation *)local_160);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_160._16_8_ != &local_140) {
    operator_delete((void *)local_160._16_8_,
                    CONCAT71(local_140._M_allocated_capacity._1_7_,local_140._M_local_buf[0]) + 1);
  }
  if (local_100 != local_f0) {
    operator_delete(local_100,local_f0[0] + 1);
  }
  if ((int)(this->m_config).log_verbosity < 3) {
    peVar2 = (this->m_logger).super___shared_ptr<PSLogger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    local_a0[0] = local_90;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_a0,m_engine_log_cat_abi_cxx11_._M_dataplus._M_p,
               m_engine_log_cat_abi_cxx11_._M_dataplus._M_p +
               m_engine_log_cat_abi_cxx11_._M_string_length);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_PSEngine::InputType>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_PSEngine::InputType>_>,_ci_less,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_PSEngine::InputType>_>_>
    ::_Rb_tree(&local_60,&to_input_type_abi_cxx11_._M_t);
    enum_to_str<PSEngine::InputType>
              ((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)local_160,p_input,
               (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_PSEngine::InputType,_ci_less,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_PSEngine::InputType>_>_>
                *)&local_60);
    std::optional<std::__cxx11::string>::value_or<char_const(&)[6]>
              (&local_80,(optional<std::__cxx11::string> *)local_160,(char (*) [6])"ERROR");
    plVar4 = (long *)std::__cxx11::string::replace((ulong)&local_80,0,(char *)0x0,0x14c981);
    plVar6 = plVar4 + 2;
    if ((long *)*plVar4 == plVar6) {
      local_110 = *plVar6;
      uStack_108 = (undefined4)plVar4[3];
      uStack_104 = *(undefined4 *)((long)plVar4 + 0x1c);
      local_120 = &local_110;
    }
    else {
      local_110 = *plVar6;
      local_120 = (long *)*plVar4;
    }
    local_118 = plVar4[1];
    *plVar4 = (long)plVar6;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    (*peVar2->_vptr_PSLogger[2])(peVar2,2,local_a0);
    if (local_120 != &local_110) {
      operator_delete(local_120,local_110 + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_80._M_dataplus._M_p != &local_80.field_2) {
      operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
    }
    if (local_140._M_local_buf[0] == '\x01') {
      local_140._M_local_buf[0] = '\0';
      if ((string *)CONCAT44(local_160._4_4_,local_160._0_4_) != (string *)(local_160 + 0x10)) {
        operator_delete((string *)CONCAT44(local_160._4_4_,local_160._0_4_),
                        (ulong)(local_160._16_8_ + 1));
      }
    }
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_PSEngine::InputType>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_PSEngine::InputType>_>,_ci_less,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_PSEngine::InputType>_>_>
    ::~_Rb_tree(&local_60);
    if (local_a0[0] != local_90) {
      operator_delete(local_a0[0],local_90[0] + 1);
    }
  }
  this->m_last_input = p_input;
  if (p_input - Up < 5) {
    pCVar7 = (this->m_current_level).cells.
             super__Vector_base<PSEngine::Cell,_std::allocator<PSEngine::Cell>_>._M_impl.
             super__Vector_impl_data._M_start;
    local_128 = (this->m_current_level).cells.
                super__Vector_base<PSEngine::Cell,_std::allocator<PSEngine::Cell>_>._M_impl.
                super__Vector_impl_data._M_finish;
    local_130 = __return_storage_ptr__;
    if (pCVar7 != local_128) {
      do {
        for (p_Var5 = (pCVar7->objects)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
            (_Rb_tree_header *)p_Var5 != &(pCVar7->objects)._M_t._M_impl.super__Rb_tree_header;
            p_Var5 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var5)) {
          this_00 = (this->m_compiled_game).player_object.
                    super___weak_ptr<CompiledGame::Object,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                    _M_pi;
          if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            iVar3 = this_00->_M_use_count;
            do {
              if (iVar3 == 0) {
                this_00 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
                break;
              }
              LOCK();
              iVar1 = this_00->_M_use_count;
              bVar9 = iVar3 == iVar1;
              if (bVar9) {
                this_00->_M_use_count = iVar3 + 1;
                iVar1 = iVar3;
              }
              iVar3 = iVar1;
              UNLOCK();
            } while (!bVar9);
          }
          if (this_00 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            bVar9 = true;
          }
          else {
            bVar9 = this_00->_M_use_count == 0;
          }
          if (bVar9) {
            peVar8 = (element_type *)0x0;
          }
          else {
            peVar8 = (this->m_compiled_game).player_object.
                     super___weak_ptr<CompiledGame::Object,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          }
          iVar3 = (*peVar8->_vptr_Object[7])(peVar8,p_Var5 + 1);
          if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
          }
          if ((char)iVar3 != '\0') {
            *(InputType *)&p_Var5[1]._M_left = p_input;
          }
        }
        pCVar7 = pCVar7 + 1;
      } while (pCVar7 != local_128);
    }
    __return_storage_ptr__ = local_130;
    next_turn(local_130,this);
  }
  else {
    if ((int)(this->m_config).log_verbosity < 5) {
      peVar2 = (this->m_logger).super___shared_ptr<PSLogger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      local_c0[0] = local_b0;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_c0,m_engine_log_cat_abi_cxx11_._M_dataplus._M_p,
                 m_engine_log_cat_abi_cxx11_._M_dataplus._M_p +
                 m_engine_log_cat_abi_cxx11_._M_string_length);
      local_e0[0] = local_d0;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_e0,"invalid input type.","");
      (*peVar2->_vptr_PSLogger[2])(peVar2,4,local_c0,local_e0);
      if (local_e0[0] != local_d0) {
        operator_delete(local_e0[0],local_d0[0] + 1);
      }
      if (local_c0[0] != local_b0) {
        operator_delete(local_c0[0],local_b0[0] + 1);
      }
      if ((this->m_config).log_operation_history_after_error == true) {
        print_operation_history(this);
      }
    }
    (__return_storage_ptr__->super__Optional_base<PSEngine::TurnHistory,_false,_false>)._M_payload.
    super__Optional_payload<PSEngine::TurnHistory,_true,_false,_false>.
    super__Optional_payload_base<PSEngine::TurnHistory>._M_engaged = false;
  }
  return __return_storage_ptr__;
}

Assistant:

optional<PSEngine::TurnHistory> PSEngine::receive_input(InputType p_input)
{
    m_operation_history.push_back(Operation(OperationType::Input,p_input));

    PS_LOG("Received input : " + enum_to_str(p_input,to_input_type).value_or("ERROR"));

    m_last_input = p_input;

    ObjectMoveType move_type = ObjectMoveType::None;
    switch (p_input)
    {
    case InputType::Up:
        move_type = ObjectMoveType::Up;
        break;
    case InputType::Down:
        move_type = ObjectMoveType::Down;
        break;
    case InputType::Left:
        move_type = ObjectMoveType::Left;
        break;
    case InputType::Right:
        move_type = ObjectMoveType::Right;
        break;
    case InputType::Action:
        move_type = ObjectMoveType::Action;
        break;
    default:
        PS_LOG_ERROR("invalid input type.");
        return nullopt;
    }

    //marking player with input
    for(Cell& cell : m_current_level.cells)
    {
        for(auto& pair :cell.objects)
        {
            if(m_compiled_game.player_object.lock()->defines(pair.first))
            {
                pair.second = move_type;
            }
        }
    }

    return next_turn();
}